

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outchar_noxlat_stream(out_stream_info *stream,char c)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ushort **ppuVar4;
  long lVar5;
  out_stream_info *stream_00;
  byte in_SIL;
  long in_RDI;
  bool bVar6;
  size_t tmpcnt;
  int tmpattr [2048];
  char tmpbuf [2048];
  char brkchar;
  char p_1;
  int pos1;
  uchar *p;
  int qspace;
  int i;
  bool local_2835;
  uint in_stack_ffffffffffffd7cc;
  mcmon obj;
  ushort uVar7;
  out_stream_info *in_stack_ffffffffffffd7d0;
  mcmcxdef *in_stack_ffffffffffffd7d8;
  ushort in_stack_ffffffffffffd96c;
  mcmon in_stack_ffffffffffffd96e;
  mcmcxdef *in_stack_ffffffffffffd970;
  undefined1 local_828 [2050];
  byte local_26;
  byte local_25;
  int local_24;
  uchar *local_20;
  int local_14;
  int local_10;
  byte local_9;
  long local_8;
  
  local_8 = in_RDI;
  if (in_SIL == 0x1a) {
    local_14 = 1;
    local_9 = 0x20;
  }
  else {
    if (in_SIL == 0x19) {
      local_9 = 9;
    }
    else {
      local_9 = in_SIL;
      if ((in_SIL < 0x80) &&
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x2000) != 0)) {
        local_9 = 0x20;
      }
    }
    local_14 = 0;
  }
  if ((((*(char *)(local_8 + 0x2818) == '\0') && (*(char *)(local_8 + 0x281a) == '\0')) ||
      (0x7f < local_9)) ||
     (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x400) == 0)) {
    if (((*(char *)(local_8 + 0x2819) != '\0') && (local_9 < 0x80)) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x400) != 0)) {
      if ((local_9 < 0x80) &&
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x100) != 0)) {
        iVar3 = tolower((int)(char)local_9);
        local_9 = (byte)iVar3;
      }
      *(undefined1 *)(local_8 + 0x2819) = 0;
    }
  }
  else {
    if ((local_9 < 0x80) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x200) != 0)) {
      iVar3 = toupper((int)(char)local_9);
      local_9 = (byte)iVar3;
    }
    *(undefined1 *)(local_8 + 0x2818) = 0;
  }
  if (*(int *)(local_8 + 0x2830) != 0) {
    if (*(short *)(local_8 + 0x2828) == -1) {
      return;
    }
    local_20 = mcmlck(in_stack_ffffffffffffd7d8,(mcmon)((ulong)in_stack_ffffffffffffd7d0 >> 0x30));
    obj = (mcmon)(in_stack_ffffffffffffd7cc >> 0x10);
    if ((uint)*(ushort *)
               (*(long *)(*(long *)**(undefined8 **)(local_8 + 0x2820) +
                         (long)((int)(uint)*(ushort *)
                                            (*(long *)(*(long *)(local_8 + 0x2820) + 0x30 +
                                                      (long)((int)(uint)*(ushort *)
                                                                         (local_8 + 0x2828) >> 8) *
                                                      8) +
                                            (long)(int)(*(ushort *)(local_8 + 0x2828) & 0xff) * 2)
                               >> 8) * 8) +
                (long)(int)(*(ushort *)
                             (*(long *)(*(long *)(local_8 + 0x2820) + 0x30 +
                                       (long)((int)(uint)*(ushort *)(local_8 + 0x2828) >> 8) * 8) +
                             (long)(int)(*(ushort *)(local_8 + 0x2828) & 0xff) * 2) & 0xff) * 0x20 +
               0x18) <= *(uint *)(local_8 + 0x282c)) {
      local_20 = mcmrealo(in_stack_ffffffffffffd970,in_stack_ffffffffffffd96e,
                          in_stack_ffffffffffffd96c);
    }
    uVar2 = *(uint *)(local_8 + 0x282c);
    *(uint *)(local_8 + 0x282c) = uVar2 + 1;
    local_20[uVar2] = local_9;
    lVar5 = *(long *)(*(long *)**(undefined8 **)(local_8 + 0x2820) +
                     (long)((int)(uint)*(ushort *)
                                        (*(long *)(*(long *)(local_8 + 0x2820) + 0x30 +
                                                  (long)((int)(uint)*(ushort *)(local_8 + 0x2828) >>
                                                        8) * 8) +
                                        (long)(int)(*(ushort *)(local_8 + 0x2828) & 0xff) * 2) >> 8)
                     * 8) +
            (long)(int)(*(ushort *)
                         (*(long *)(*(long *)(local_8 + 0x2820) + 0x30 +
                                   (long)((int)(uint)*(ushort *)(local_8 + 0x2828) >> 8) * 8) +
                         (long)(int)(*(ushort *)(local_8 + 0x2828) & 0xff) * 2) & 0xff) * 0x20;
    *(ushort *)(lVar5 + 0x14) = *(ushort *)(lVar5 + 0x14) | 1;
    mcmunlck((mcmcxdef *)in_stack_ffffffffffffd7d0,obj);
    return;
  }
  if ((int)(*(byte *)(local_8 + 9) + 1) < G_os_linewidth) {
    if (((local_9 < 0x80) &&
        (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x2000) != 0)) &&
       ((local_9 != 9 &&
        (((*(char *)(local_8 + 9) == '\0' && (local_14 == 0)) && (*(int *)(local_8 + 0x296c) == 0)))
        ))) {
      return;
    }
    if (((local_9 < 0x80) &&
        (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x2000) != 0)) &&
       ((local_9 != 9 &&
        (((*(char *)(local_8 + 9) != '\0' && (local_14 == 0)) && (*(int *)(local_8 + 0x296c) == 0)))
        ))) {
      local_24 = *(byte *)(local_8 + 8) - 1;
      local_25 = *(byte *)(local_8 + 0x10 + (long)local_24);
      if ((local_25 < 0x80) &&
         (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_25] & 0x2000) != 0)) {
        return;
      }
      if (doublespace != 0) {
        while( true ) {
          bVar6 = false;
          if ((((local_24 != 0) && (bVar6 = true, local_25 != 0x22)) &&
              (bVar6 = true, local_25 != 0x27)) &&
             ((bVar6 = true, local_25 != 0x29 && (bVar6 = true, local_25 != 0x5d)))) {
            bVar6 = local_25 == 0x7d;
          }
          if (!bVar6) break;
          local_24 = local_24 + -1;
          local_25 = *(byte *)(local_8 + 0x10 + (long)local_24);
        }
        if (((local_25 == 0x2e) || (local_25 == 0x3f)) || ((local_25 == 0x21 || (local_25 == 0x3a)))
           ) {
          *(undefined4 *)(local_8 + 0x810 + (ulong)*(byte *)(local_8 + 8) * 4) =
               *(undefined4 *)(local_8 + 0x2810);
          bVar1 = *(byte *)(local_8 + 8);
          *(byte *)(local_8 + 8) = bVar1 + 1;
          *(byte *)(local_8 + 0x10 + (ulong)bVar1) = local_9;
          *(char *)(local_8 + 9) = *(char *)(local_8 + 9) + '\x01';
        }
      }
    }
    *(undefined4 *)(local_8 + 0x810 + (ulong)*(byte *)(local_8 + 8) * 4) =
         *(undefined4 *)(local_8 + 0x2810);
    bVar1 = *(byte *)(local_8 + 8);
    *(byte *)(local_8 + 8) = bVar1 + 1;
    *(byte *)(local_8 + 0x10 + (ulong)bVar1) = local_9;
    *(char *)(local_8 + 9) = *(char *)(local_8 + 9) + '\x01';
    return;
  }
  if ((((local_9 < 0x80) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_9] & 0x2000) != 0)) &&
      (local_9 != 9)) && (local_14 == 0)) {
    if (*(char *)(local_8 + 0x10 + (long)(int)(*(byte *)(local_8 + 8) - 1)) == ' ') {
      return;
    }
    *(undefined4 *)(local_8 + 0x810 + (ulong)*(byte *)(local_8 + 8) * 4) =
         *(undefined4 *)(local_8 + 0x2810);
    bVar1 = *(byte *)(local_8 + 8);
    *(byte *)(local_8 + 8) = bVar1 + 1;
    *(undefined1 *)(local_8 + 0x10 + (ulong)bVar1) = 0x20;
    return;
  }
  local_10 = *(byte *)(local_8 + 8) - 1;
  if (local_9 == 0x2d) {
    while( true ) {
      uVar7 = (ushort)(in_stack_ffffffffffffd7cc >> 0x10);
      in_stack_ffffffffffffd7cc = (uint)uVar7 << 0x10;
      if (-1 < local_10) {
        in_stack_ffffffffffffd7cc =
             (uint)CONCAT21(uVar7,*(char *)(local_8 + 0x10 + (long)local_10) == '-') << 8;
      }
      if ((char)(in_stack_ffffffffffffd7cc >> 8) == '\0') break;
      local_10 = local_10 + -1;
    }
    while( true ) {
      in_stack_ffffffffffffd7cc = in_stack_ffffffffffffd7cc & 0xffffff00;
      if (-1 < local_10) {
        local_2835 = false;
        if (*(byte *)(local_8 + 0x10 + (long)local_10) < 0x80) {
          ppuVar4 = __ctype_b_loc();
          local_2835 = ((*ppuVar4)[(int)(uint)*(byte *)(local_8 + 0x10 + (long)local_10)] & 0x2000)
                       != 0;
        }
        in_stack_ffffffffffffd7cc = CONCAT31((int3)(in_stack_ffffffffffffd7cc >> 8),local_2835);
      }
      if ((char)in_stack_ffffffffffffd7cc == '\0') break;
      local_10 = local_10 + -1;
    }
  }
  do {
    bVar6 = false;
    if (-1 < local_10) {
      if (*(byte *)(local_8 + 0x10 + (long)local_10) < 0x80) {
        ppuVar4 = __ctype_b_loc();
        bVar6 = false;
        if (((*ppuVar4)[(int)(uint)*(byte *)(local_8 + 0x10 + (long)local_10)] & 0x2000) != 0)
        goto LAB_00281bc0;
      }
      bVar6 = false;
      if (*(int *)(local_8 + 0x2840) == 0) {
        bVar6 = *(char *)(local_8 + 0x10 + (long)local_10) == '-';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
LAB_00281bc0:
    if (!bVar6) {
      if (local_10 < 0) {
        out_flushline(in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7cc);
        *(undefined1 *)(local_8 + 8) = 0;
        *(undefined1 *)(local_8 + 9) = 0;
        *(undefined1 *)(local_8 + 0x10) = 0;
      }
      else {
        local_26 = *(byte *)(local_8 + 0x10 + (long)local_10);
        *(undefined1 *)(local_8 + 0x10 + (ulong)*(byte *)(local_8 + 8)) = 0;
        stream_00 = (out_stream_info *)strlen((char *)(local_8 + 0x10 + (long)(local_10 + 1)));
        memcpy(local_828,(void *)(local_8 + 0x10 + (long)(local_10 + 1)),
               (size_t)((long)&stream_00->do_print + 1));
        memcpy(&stack0xffffffffffffd7d8,(void *)(local_8 + 0x810 + (long)(local_10 + 1) * 4),
               (long)stream_00 << 2);
        if ((local_26 < 0x80) &&
           (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)local_26] & 0x2000) != 0)) {
          *(undefined1 *)(local_8 + 0x10 + (long)local_10) = 0;
        }
        else {
          *(undefined1 *)(local_8 + 0x10 + (long)(local_10 + 1)) = 0;
        }
        out_flushline(stream_00,in_stack_ffffffffffffd7cc);
        memcpy((void *)(local_8 + 0x10),local_828,(size_t)((long)&stream_00->do_print + 1));
        memcpy((void *)(local_8 + 0x810),&stack0xffffffffffffd7d8,(long)stream_00 << 2);
        *(char *)(local_8 + 8) = (char)stream_00;
        *(undefined1 *)(local_8 + 9) = 0;
        for (local_10 = 0; local_10 < (int)(uint)*(byte *)(local_8 + 8); local_10 = local_10 + 1) {
          if (0x19 < *(byte *)(local_8 + 0x10 + (long)local_10)) {
            *(char *)(local_8 + 9) = *(char *)(local_8 + 9) + '\x01';
          }
        }
      }
      *(undefined4 *)(local_8 + 0x810 + (ulong)*(byte *)(local_8 + 8) * 4) =
           *(undefined4 *)(local_8 + 0x2810);
      bVar1 = *(byte *)(local_8 + 8);
      *(byte *)(local_8 + 8) = bVar1 + 1;
      *(byte *)(local_8 + 0x10 + (ulong)bVar1) = local_9;
      *(char *)(local_8 + 9) = *(char *)(local_8 + 9) + '\x01';
      return;
    }
    local_10 = local_10 + -1;
  } while( true );
}

Assistant:

static void outchar_noxlat_stream(out_stream_info *stream, char c)
{
    int  i;
    int  qspace;
    
    /* check for the special quoted space character */
    if (c == QSPACE)
    {
        /* it's a quoted space - note it and convert it to a regular space */
        qspace = 1;
        c = ' ';
    }
    else if (c == QTAB)
    {
        /* it's a hard tab - convert it to an ordinary tab */
        c = '\t';
        qspace = 0;
    }
    else
    {
        /* translate any whitespace character to a regular space character */
        if (outissp(c))
            c = ' ';
        
        /* it's not a quoted space */
        qspace = 0;
    }

    /* check for the caps/nocaps flags */
    if ((stream->capsflag || stream->allcapsflag) && outisal(c))
    {
        /* capsflag is set, so capitalize this character */
        if (outislo(c))
            c = toupper(c);

        /* okay, we've capitalized something; clear flag */
        stream->capsflag = 0;
    }
    else if (stream->nocapsflag && outisal(c))
    {
        /* nocapsflag is set, so minisculize this character */
        if (outisup(c))
            c = tolower(c);

        /* clear the flag now that we've done the job */
        stream->nocapsflag = 0;
    }

    /* if in capture mode, simply capture the character */
    if (stream->capturing)
    {
        uchar *p;

        /* if we have a valid capture object, copy to it */
        if (stream->capture_obj != MCMONINV)
        {
            /* lock the object holding the captured text */
            p = mcmlck(stream->capture_ctx, stream->capture_obj);
            
            /* make sure the capture object is big enough */
            if (mcmobjsiz(stream->capture_ctx, stream->capture_obj)
                <= stream->capture_ofs)
            {
                /* expand the object by another 256 bytes */
                p = mcmrealo(stream->capture_ctx, stream->capture_obj,
                             (ushort)(stream->capture_ofs + 256));
            }
            
            /* add this character */
            *(p + stream->capture_ofs++) = c;
            
            /* unlock the capture object */
            mcmtch(stream->capture_ctx, stream->capture_obj);
            mcmunlck(stream->capture_ctx, stream->capture_obj);
        }

        /*
         *   we're done - we don't want to actually display the character
         *   while capturing 
         */
        return;
    }

    /* add the character to out output buffer, flushing as needed */
    if (stream->linecol + 1 < G_os_linewidth)
    {
        /* 
         *   there's room for this character, so add it to the buffer 
         */
        
        /* ignore non-quoted space at start of line outside of PRE */
        if (outissp(c) && c != '\t' && stream->linecol == 0 && !qspace
            && stream->html_pre_level == 0)
            return;

        /* is this a non-quoted space not at the start of the line? */
        if (outissp(c) && c != '\t' && stream->linecol != 0 && !qspace
            && stream->html_pre_level == 0)
        {
            int  pos1 = stream->linepos - 1;
            char p = stream->linebuf[pos1];     /* check previous character */

            /* ignore repeated spaces - collapse into a single space */
            if (outissp(p))
                return;

            /*
             *   Certain punctuation requires a double space: a period, a
             *   question mark, an exclamation mark, or a colon; or any of
             *   these characters followed by any number of single and/or
             *   double quotes.  First, scan back to before any quotes, if
             *   are on one now, then check the preceding character; if
             *   it's one of the punctuation marks requiring a double
             *   space, add this space a second time.  (In addition to
             *   scanning back past quotes, scan past parentheses,
             *   brackets, and braces.)  Don't double the spacing if we're
             *   not in the normal doublespace mode; some people may
             *   prefer single spacing after punctuation, so we make this
             *   a run-time option.  
             */
            if (doublespace)
            {
                /* find the previous relevant punctuation character */
                while (pos1 &&
                       (p == '"' || p == '\'' || p == ')' || p == ']'
                        || p == '}'))
                {
                    p = stream->linebuf[--pos1];
                }
                if ( p == '.' || p == '?' || p == '!' || p == ':' )
                {
                    /* a double-space is required after this character */
                    stream->attrbuf[stream->linepos] = stream->cur_attr;
                    stream->linebuf[stream->linepos++] = c;
                    ++(stream->linecol);
                }
            }
        }

        /* add this character to the buffer */
        stream->attrbuf[stream->linepos] = stream->cur_attr;
        stream->linebuf[stream->linepos++] = c;

        /* advance the output column position */
        ++(stream->linecol);
        return;
    }

    /*
     *   The line would overflow if this character were added.  Find the
     *   most recent word break, and output the line up to the previous
     *   word.  Note that if we're trying to output a space, we'll just
     *   add it to the line buffer.  If the last character of the line
     *   buffer is already a space, we won't do anything right now.  
     */
    if (outissp(c) && c != '\t' && !qspace)
    {
        /* this is a space, so we're at a word break */
        if (stream->linebuf[stream->linepos - 1] != ' ')
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
        }
        return;
    }
    
    /*
     *   Find the most recent word break: look for a space or dash, starting
     *   at the end of the line.  
     *   
     *   If we're about to write a hyphen, we want to skip all contiguous
     *   hyphens, because we want to keep them together as a single
     *   punctuation mark; then keep going in the normal manner, which will
     *   keep the hyphens plus the word they're attached to together as a
     *   single unit.  If spaces precede the sequence of hyphens, include
     *   the prior word as well.  
     */
    i = stream->linepos - 1;
    if (c == '-')
    {
        /* skip any contiguous hyphens at the end of the line */
        for ( ; i >= 0 && stream->linebuf[i] == '-' ; --i) ;
        
        /* skip any spaces preceding the sequence of hyphens */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* 
     *   Now find the preceding space.  If we're doing our own wrapping
     *   (i.e., we're not using OS line wrapping), then look for the
     *   nearest hyphen as well. 
     */
    for ( ; i >= 0 && !outissp(stream->linebuf[i])
          && !(!stream->os_line_wrap && stream->linebuf[i] == '-') ; --i) ;

    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /* 
         *   we didn't find any good place to break - flush the entire
         *   line as-is, breaking arbitrarily in the middle of a word 
         */
        out_flushline(stream, FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        stream->linepos = 0;
        stream->linecol = 0;
        stream->linebuf[0] = '\0';
    }
    else
    {
        char brkchar;
        char tmpbuf[MAXWIDTH];
        int tmpattr[MAXWIDTH];
        size_t tmpcnt;

        /* remember the word-break character */        
        brkchar = stream->linebuf[i];

        /* null-terminate the line buffer */        
        stream->linebuf[stream->linepos] = '\0';

        /* the next line starts after the break - save a copy */
        tmpcnt = strlen(&stream->linebuf[i+1]);
        memcpy(tmpbuf, &stream->linebuf[i+1], tmpcnt + 1);
        memcpy(tmpattr, &stream->attrbuf[i+1], tmpcnt * sizeof(tmpattr[0]));

        /* 
         *   terminate the buffer at the space or after the hyphen,
         *   depending on where we broke 
         */
        if (outissp(brkchar))
            stream->linebuf[i] = '\0';
        else
            stream->linebuf[i+1] = '\0';

        /* write out everything up to the word break */
        out_flushline(stream, TRUE);

        /* copy the next line into line buffer */
        memcpy(stream->linebuf, tmpbuf, tmpcnt + 1);
        memcpy(stream->attrbuf, tmpattr, tmpcnt * sizeof(tmpattr[0]));
        stream->linepos = tmpcnt;

        /* 
         *   figure what column we're now in - count all of the printable
         *   characters in the new line 
         */
        for (stream->linecol = 0, i = 0 ; i < stream->linepos ; ++i)
        {
            /* if it's printable, count it */
            if (((unsigned char)stream->linebuf[i]) >= 26)
                ++(stream->linecol);
        }
    }
    
    /* add the new character to buffer */
    stream->attrbuf[stream->linepos] = stream->cur_attr;
    stream->linebuf[stream->linepos++] = c;

    /* advance the column counter */
    ++(stream->linecol);
}